

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

void QUtil::read_lines_from_file
               (function<bool_(char_&)> *next_char,
               list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines,bool preserve_eol)

{
  reference pvVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  reference pcVar6;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  char local_29;
  reference pvStack_28;
  char c;
  string *buf;
  list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *plStack_18;
  bool preserve_eol_local;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *lines_local;
  function<bool_(char_&)> *next_char_local;
  
  pvStack_28 = (reference)0x0;
  buf._7_1_ = preserve_eol;
  plStack_18 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines;
  lines_local = (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)next_char;
  while (bVar2 = std::function<bool_(char_&)>::operator()(next_char,&local_29), bVar2) {
    if (pvStack_28 == (reference)0x0) {
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[1]>(plStack_18,(char (*) [1])0x42fa16);
      pvStack_28 = std::__cxx11::
                   list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)plStack_18);
      std::__cxx11::string::reserve((ulong)pvStack_28);
    }
    lVar4 = std::__cxx11::string::capacity();
    lVar5 = std::__cxx11::string::size();
    pvVar1 = pvStack_28;
    if (lVar4 == lVar5) {
      std::__cxx11::string::capacity();
      std::__cxx11::string::reserve((ulong)pvVar1);
    }
    if (local_29 == '\n') {
      if ((buf._7_1_ & 1) == 0) {
        uVar3 = std::__cxx11::string::empty();
        bVar2 = false;
        if ((uVar3 & 1) == 0) {
          std::__cxx11::string::rbegin();
          pcVar6 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*(&local_38);
          bVar2 = *pcVar6 == '\r';
        }
        pvVar1 = pvStack_28;
        if (bVar2) {
          lVar4 = std::__cxx11::string::length();
          std::__cxx11::string::erase((ulong)pvVar1,lVar4 - 1);
        }
      }
      else {
        std::__cxx11::string::append((ulong)pvStack_28,'\x01');
      }
      pvStack_28 = (reference)0x0;
    }
    else {
      std::__cxx11::string::append((ulong)pvStack_28,'\x01');
    }
  }
  return;
}

Assistant:

void
QUtil::read_lines_from_file(
    std::function<bool(char&)> next_char, std::list<std::string>& lines, bool preserve_eol)
{
    std::string* buf = nullptr;
    char c;
    while (next_char(c)) {
        if (buf == nullptr) {
            lines.emplace_back("");
            buf = &(lines.back());
            buf->reserve(80);
        }

        if (buf->capacity() == buf->size()) {
            buf->reserve(buf->capacity() * 2);
        }
        if (c == '\n') {
            if (preserve_eol) {
                buf->append(1, c);
            } else {
                // Remove any carriage return that preceded the newline and discard the newline
                if ((!buf->empty()) && ((*(buf->rbegin())) == '\r')) {
                    buf->erase(buf->length() - 1);
                }
            }
            buf = nullptr;
        } else {
            buf->append(1, c);
        }
    }
}